

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void mtranspose(double *sig,int rows,int cols,double *col)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (cols < 0x400 || rows < 0x400) {
    if (0 < rows) {
      uVar2 = 0;
      uVar3 = 0;
      do {
        if (0 < cols) {
          uVar4 = 0;
          pdVar1 = col;
          do {
            *pdVar1 = sig[uVar2 + uVar4];
            uVar4 = uVar4 + 1;
            pdVar1 = pdVar1 + (uint)rows;
          } while ((uint)cols != uVar4);
        }
        uVar3 = uVar3 + 1;
        col = col + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + cols);
      } while (uVar3 != (uint)rows);
    }
    return;
  }
  if (rows < 0x40 && cols < 0x40) {
    if (0 < rows) {
      uVar2 = 0;
      uVar3 = 0;
      do {
        if (0 < cols) {
          uVar4 = 0;
          pdVar1 = col;
          do {
            *pdVar1 = sig[uVar2 + uVar4];
            uVar4 = uVar4 + 1;
            pdVar1 = pdVar1 + (uint)rows;
          } while ((uint)cols != uVar4);
        }
        uVar3 = uVar3 + 1;
        col = col + 1;
        uVar2 = (ulong)(uint)((int)uVar2 + cols);
      } while (uVar3 != (uint)rows);
    }
    return;
  }
  rtranspose(sig,rows,cols,col,rows,cols);
  return;
}

Assistant:

void mtranspose(double *sig, int rows, int cols,double *col) {
	int block;
	
	block = (int) BLOCKSIZE * 16;

	if (rows >= block && cols >= block)  {
		ctranspose(sig,rows,cols,col);
	} else {
		stranspose(sig,rows,cols,col);
	}
}